

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O3

void ihevc_sao_edge_offset_class3_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht
               )

{
  UWORD8 UVar1;
  UWORD8 UVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  UWORD8 *pUVar8;
  long lVar9;
  ulong uVar10;
  WORD8 *pWVar11;
  size_t __n;
  ulong uVar12;
  UWORD8 UVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  char cVar21;
  WORD8 au1_sign_up [64];
  UWORD8 au1_mask [64];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_src_left_tmp [128];
  byte local_1fc;
  byte local_1f4;
  byte local_1f0;
  byte local_1ec;
  UWORD8 *local_1c0;
  undefined8 local_180;
  char acStack_178 [64];
  uint local_138 [16];
  undefined1 local_f8 [64];
  UWORD8 local_b8 [136];
  
  lVar7 = (long)wd;
  local_138[0] = 0xffffffff;
  local_138[1] = 0xffffffff;
  local_138[2] = 0xffffffff;
  local_138[3] = 0xffffffff;
  local_138[4] = 0xffffffff;
  local_138[5] = 0xffffffff;
  local_138[6] = 0xffffffff;
  local_138[7] = 0xffffffff;
  local_138[8] = 0xffffffff;
  local_138[9] = 0xffffffff;
  local_138[10] = 0xffffffff;
  local_138[0xb] = 0xffffffff;
  local_138[0xc] = 0xffffffff;
  local_138[0xd] = 0xffffffff;
  local_138[0xe] = 0xffffffff;
  local_138[0xf] = 0xffffffff;
  lVar17 = (long)(wd + -2);
  lVar9 = lVar7 + -1;
  if (0 < ht) {
    pUVar8 = pu1_src + lVar9;
    uVar10 = 0;
    do {
      local_b8[uVar10 * 2] = pUVar8[-1];
      local_b8[uVar10 * 2 + 1] = *pUVar8;
      uVar10 = uVar10 + 1;
      pUVar8 = pUVar8 + src_strd;
    } while ((uint)ht != uVar10);
  }
  UVar1 = pu1_src_top[lVar17];
  UVar2 = pu1_src_top[lVar7 + -1];
  uVar10 = (ulong)(uint)wd;
  if (0 < wd) {
    memcpy(local_f8,pu1_src + (ht + -1) * src_strd,uVar10);
  }
  local_1ec = pu1_src[lVar17];
  if (pu1_avail[5] == '\0') {
    local_1f4 = pu1_src[lVar9];
  }
  else {
    uVar19 = local_1ec == *pu1_src_top_right ^ 3;
    if (local_1ec < *pu1_src_top_right) {
      uVar19 = 1;
    }
    uVar16 = 0xffffffff;
    if (pu1_src[wd + src_strd + -4] <= local_1ec) {
      uVar16 = (uint)(local_1ec != pu1_src[wd + src_strd + -4]);
    }
    if (uVar16 + uVar19 != 2) {
      iVar18 = (int)pi1_sao_offset_u[gi4_ihevc_table_edge_idx[uVar16 + uVar19]] + (uint)local_1ec;
      local_1ec = 0xff;
      if (iVar18 < 0x100) {
        iVar14 = 0;
        if (0 < iVar18) {
          iVar14 = iVar18;
        }
        local_1ec = (byte)iVar14;
      }
    }
    local_1f4 = pu1_src[lVar9];
    uVar19 = local_1f4 == pu1_src_top_right[1] ^ 3;
    if (local_1f4 < pu1_src_top_right[1]) {
      uVar19 = 1;
    }
    uVar16 = 0xffffffff;
    if (pu1_src[wd + src_strd + -3] <= local_1f4) {
      uVar16 = (uint)(local_1f4 != pu1_src[wd + src_strd + -3]);
    }
    if (uVar16 + uVar19 != 2) {
      iVar18 = (int)pi1_sao_offset_v[gi4_ihevc_table_edge_idx[uVar16 + uVar19]] + (uint)local_1f4;
      if (iVar18 < 0x100) {
        iVar14 = 0;
        if (0 < iVar18) {
          iVar14 = iVar18;
        }
        local_1f4 = (byte)iVar14;
      }
      else {
        local_1f4 = 0xff;
      }
    }
  }
  iVar18 = ht + -1;
  iVar14 = iVar18 * src_strd;
  local_1fc = pu1_src[iVar14];
  if (pu1_avail[6] == '\0') {
    local_1f0 = pu1_src[(long)iVar14 + 1];
    goto LAB_00161f49;
  }
  uVar19 = local_1fc == pu1_src[(iVar14 - src_strd) + 2] ^ 3;
  if (local_1fc < pu1_src[(iVar14 - src_strd) + 2]) {
    uVar19 = 1;
  }
  uVar16 = 0xffffffff;
  if (*pu1_src_bot_left <= local_1fc) {
    uVar16 = (uint)(local_1fc != *pu1_src_bot_left);
  }
  uVar5 = (uint)local_1fc;
  if (uVar16 + uVar19 == 2) {
LAB_00161e9e:
    local_1fc = (byte)uVar5;
  }
  else {
    uVar19 = (int)pi1_sao_offset_u[gi4_ihevc_table_edge_idx[uVar16 + uVar19]] + (uint)local_1fc;
    local_1fc = 0xff;
    if ((int)uVar19 < 0x100) {
      uVar5 = 0;
      if (0 < (int)uVar19) {
        uVar5 = uVar19;
      }
      goto LAB_00161e9e;
    }
  }
  local_1f0 = pu1_src[(long)iVar14 + 1];
  uVar19 = local_1f0 == pu1_src[(iVar14 - src_strd) + 3] ^ 3;
  if (local_1f0 < pu1_src[(iVar14 - src_strd) + 3]) {
    uVar19 = 1;
  }
  uVar16 = 0xffffffff;
  if (pu1_src_bot_left[1] <= local_1f0) {
    uVar16 = (uint)(local_1f0 != pu1_src_bot_left[1]);
  }
  if (uVar16 + uVar19 != 2) {
    iVar14 = (int)pi1_sao_offset_v[gi4_ihevc_table_edge_idx[uVar16 + uVar19]] + (uint)local_1f0;
    local_1f0 = 0xff;
    if (iVar14 < 0x100) {
      iVar15 = 0;
      if (0 < iVar14) {
        iVar15 = iVar14;
      }
      local_1f0 = (byte)iVar15;
    }
  }
LAB_00161f49:
  if (*pu1_avail == '\0') {
    local_138[0] = local_138[0] & 0xffffff00;
  }
  UVar13 = pu1_avail[2];
  if (UVar13 == '\0') {
    pu1_src = pu1_src + src_strd;
    local_1c0 = pu1_src_left + 2;
    ht = iVar18;
    if (2 < wd) {
      lVar6 = 0;
      do {
        cVar21 = pu1_src[lVar6] != pu1_src[(2 - src_strd) + (int)lVar6];
        if (pu1_src[lVar6] < pu1_src[(2 - src_strd) + (int)lVar6]) {
          cVar21 = -1;
        }
        acStack_178[lVar6] = cVar21;
        lVar6 = lVar6 + 1;
      } while (lVar17 != lVar6);
    }
  }
  else {
    local_1c0 = pu1_src_left;
    if (2 < wd) {
      lVar6 = 0;
      do {
        cVar21 = pu1_src[lVar6] != pu1_src_top[lVar6 + 2];
        if (pu1_src[lVar6] < pu1_src_top[lVar6 + 2]) {
          cVar21 = -1;
        }
        acStack_178[lVar6] = cVar21;
        lVar6 = lVar6 + 1;
      } while (lVar17 != lVar6);
    }
  }
  if (pu1_avail[1] == '\0') {
    *(undefined1 *)((long)local_138 + (long)((int)lVar9 >> 1)) = 0;
  }
  uVar19 = ht - (uint)(pu1_avail[3] == '\0');
  if (0 < (int)uVar19) {
    local_180 = (long)((wd - src_strd) + 1);
    iVar18 = 2;
    uVar20 = 0;
    do {
      cVar21 = pu1_src[lVar17] != pu1_src[wd - src_strd];
      if (pu1_src[lVar17] < pu1_src[wd - src_strd]) {
        cVar21 = -1;
      }
      acStack_178[lVar17] = cVar21;
      cVar21 = pu1_src[lVar9] != pu1_src[local_180];
      if (pu1_src[lVar9] < pu1_src[local_180]) {
        cVar21 = -1;
      }
      acStack_178[lVar7 + -1] = cVar21;
      if (0 < wd) {
        uVar12 = 0;
        do {
          pWVar11 = pi1_sao_offset_u;
          if ((uVar12 & 1) != 0) {
            pWVar11 = pi1_sao_offset_v;
          }
          bVar3 = pu1_src[uVar12];
          if (uVar12 < 2) {
            if (bVar3 < local_1c0[uVar12 + (long)iVar18]) {
              lVar6 = (long)acStack_178[uVar12] + 1;
            }
            else {
              lVar6 = (long)acStack_178[uVar12] + 2 +
                      (ulong)(local_1c0[uVar12 + (long)iVar18] < bVar3);
            }
          }
          else {
            bVar4 = pu1_src[src_strd + -2 + (int)uVar12];
            if (bVar3 < bVar4) {
              lVar6 = (long)acStack_178[uVar12] + 1;
              cVar21 = '\x01';
            }
            else {
              lVar6 = (long)acStack_178[uVar12] + (ulong)(bVar4 < bVar3) + 2;
              cVar21 = -(bVar4 < bVar3);
            }
            acStack_178[uVar12 - 2] = cVar21;
          }
          uVar16 = (uint)*(byte *)((long)local_138 + (uVar12 >> 1 & 0x7fffffff)) &
                   gi4_ihevc_table_edge_idx[lVar6];
          if (uVar16 != 0) {
            iVar14 = (int)pWVar11[uVar16] + (uint)bVar3;
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            pu1_src[uVar12] = (UWORD8)iVar14;
          }
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      pu1_src = pu1_src + src_strd;
      uVar20 = uVar20 + 1;
      iVar18 = iVar18 + 2;
    } while (uVar20 != uVar19);
    UVar13 = pu1_avail[2];
  }
  uVar5 = uVar19 + 1;
  uVar16 = uVar19;
  if (UVar13 == '\0') {
    uVar16 = uVar5;
  }
  pu1_src[(int)((wd + -2) - uVar16 * src_strd)] = local_1ec;
  uVar16 = uVar19;
  if (pu1_avail[2] == '\0') {
    uVar16 = uVar5;
  }
  pu1_src[(int)(~(uVar16 * src_strd) + wd)] = local_1f4;
  lVar9 = 0;
  if (pu1_avail[3] != '\0') {
    lVar9 = (long)-src_strd;
  }
  pu1_src[lVar9] = local_1fc;
  lVar9 = 1;
  if (pu1_avail[3] != '\0') {
    lVar9 = (long)(1 - src_strd);
  }
  pu1_src[lVar9] = local_1f0;
  if (pu1_avail[2] == '\0') {
    uVar19 = uVar5;
  }
  UVar13 = pu1_avail[3];
  *pu1_src_top_left = UVar1;
  pu1_src_top_left[1] = UVar2;
  iVar18 = (UVar13 == '\0') + uVar19;
  if (iVar18 != 0 && SCARRY4((uint)(UVar13 == '\0'),uVar19) == iVar18 < 0) {
    __n = 1;
    if (1 < iVar18 * 2) {
      __n = (size_t)(uint)(iVar18 * 2);
    }
    memcpy(pu1_src_left,local_b8,__n);
  }
  if (0 < wd) {
    memcpy(pu1_src_top,local_f8,uVar10);
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class3_chroma(UWORD8 *pu1_src,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_src_left,
                                         UWORD8 *pu1_src_top,
                                         UWORD8 *pu1_src_top_left,
                                         UWORD8 *pu1_src_top_right,
                                         UWORD8 *pu1_src_bot_left,
                                         UWORD8 *pu1_avail,
                                         WORD8 *pi1_sao_offset_u,
                                         WORD8 *pi1_sao_offset_v,
                                         WORD32 wd,
                                         WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[2 * MAX_CTB_SIZE], au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 au1_src_top_left_tmp[2];
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    UWORD8 *pu1_src_left_cpy;
    WORD8 u1_sign_down;
    WORD32 bit_depth;

    UWORD8 u1_pos_wd_0_tmp_u;
    UWORD8 u1_pos_wd_0_tmp_v;
    UWORD8 u1_pos_0_ht_tmp_u;
    UWORD8 u1_pos_0_ht_tmp_v;

    bit_depth = BIT_DEPTH_CHROMA;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    au1_src_top_left_tmp[0] = pu1_src_top[wd - 2];
    au1_src_top_left_tmp[1] = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[2 * row] = pu1_src[row * src_strd + wd - 2];
        au1_src_left_tmp[2 * row + 1] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    /* If top-right is available, process separately */
    if(0 != pu1_avail[5])
    {
        WORD32 edge_idx;

        /* U */
        edge_idx = 2 + SIGN(pu1_src[wd - 2] - pu1_src_top_right[0]) +
                        SIGN(pu1_src[wd - 2] - pu1_src[wd - 2 - 2 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp_u = CLIP3(pu1_src[wd - 2] + pi1_sao_offset_u[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp_u = pu1_src[wd - 2];
        }

        /* V */
        edge_idx = 2 + SIGN(pu1_src[wd - 1] - pu1_src_top_right[1]) +
                        SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 - 2 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp_v = CLIP3(pu1_src[wd - 1] + pi1_sao_offset_v[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp_v = pu1_src[wd - 1];
        }
    }
    else
    {
        u1_pos_wd_0_tmp_u = pu1_src[wd - 2];
        u1_pos_wd_0_tmp_v = pu1_src[wd - 1];
    }

    /* If bottom-left is available, process separately */
    if(0 != pu1_avail[6])
    {
        WORD32 edge_idx;

        /* U */
        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src[(ht - 1) * src_strd + 2 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src_bot_left[0]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp_u = CLIP3(pu1_src[(ht - 1) * src_strd] + pi1_sao_offset_u[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp_u = pu1_src[(ht - 1) * src_strd];
        }

        /* V */
        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd + 1] - pu1_src[(ht - 1) * src_strd + 1 + 2 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd + 1] - pu1_src_bot_left[1]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp_v = CLIP3(pu1_src[(ht - 1) * src_strd + 1] + pi1_sao_offset_v[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp_v = pu1_src[(ht - 1) * src_strd + 1];
        }
    }
    else
    {
        u1_pos_0_ht_tmp_u = pu1_src[(ht - 1) * src_strd];
        u1_pos_0_ht_tmp_v = pu1_src[(ht - 1) * src_strd + 1];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 2;
        for(col = 0; col < wd - 2; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col + 2 - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd - 2; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col + 2]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[(wd - 1) >> 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            au1_sign_up[wd - 2] = SIGN(pu1_src[wd - 2] - pu1_src[wd - 2 + 2 - src_strd]);
            au1_sign_up[wd - 1] = SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 + 2 - src_strd]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;
                WORD8 *pi1_sao_offset;

                pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;

                u1_sign_down = SIGN(pu1_src[col] - ((col < 2) ? pu1_src_left_cpy[2 * (row + 1) + col] :
                                                                pu1_src[col - 2 + src_strd]));
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                if(col > 1)
                    au1_sign_up[col - 2] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col >> 1];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 2] = u1_pos_wd_0_tmp_u;
        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 1] = u1_pos_wd_0_tmp_v;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0)] = u1_pos_0_ht_tmp_u;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0) + 1] = u1_pos_0_ht_tmp_v;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    pu1_src_top_left[0] = au1_src_top_left_tmp[0];
    pu1_src_top_left[1] = au1_src_top_left_tmp[1];
    for(row = 0; row < 2 * ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}